

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer *ppbVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  ostream *poVar4;
  int iVar5;
  size_t i;
  long lVar6;
  ulong uVar7;
  _List_node_base *p_Var8;
  pointer piVar9;
  long lVar10;
  string local_d8 [32];
  undefined8 *local_b8;
  char *local_b0;
  undefined1 local_a8 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pieces;
  string sub;
  undefined1 auStack_50 [4];
  int n;
  vector<int,_std::allocator<int>_> perm;
  
  std::istream::operator>>((istream *)&std::cin,(int *)(sub.field_2._M_local_buf + 0xc));
  std::istream::ignore();
  subs.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  ppbVar1 = &pieces.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8 = (undefined1  [8])local_a8;
  subs.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_a8;
  for (iVar5 = 0; iVar5 < (int)sub.field_2._12_4_; iVar5 = iVar5 + 1) {
    sub._M_dataplus._M_p = (pointer)0x0;
    sub._M_string_length._0_1_ = 0;
    pieces.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&sub._M_string_length;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)ppbVar1);
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)ppbVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8,(value_type *)ppbVar1);
    std::__cxx11::string::~string((string *)ppbVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&subs.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node._M_size,
           (size_type)
           subs.
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev,
           (allocator_type *)
           &pieces.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)auStack_50,
             (size_type)
             subs.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev,
             (allocator_type *)
             &pieces.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  lVar6 = 0;
  lVar10 = 0;
  piVar9 = (pointer)0x0;
  p_Var8 = (_List_node_base *)local_a8;
  while (p_Var8 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)local_a8) {
    _auStack_50[lVar10] = (int)lVar10;
    std::__cxx11::string::_M_assign
              ((string *)
               (subs.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size + lVar6));
    piVar9 = (pointer)((long)piVar9 + (long)p_Var8[1]._M_prev);
    lVar10 = lVar10 + 1;
    lVar6 = lVar6 + 0x20;
  }
  ppbVar1 = &pieces.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar9;
  do {
    local_b8 = &std::cerr;
    local_b0 = ", ";
    std::
    copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::ostream_iterator<int,char,std::char_traits<char>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)ppbVar1,
               _auStack_50,
               (ostream_iterator<int,_char,_std::char_traits<char>_> *)
               perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::__cxx11::string::string
              ((string *)ppbVar1,
               (string *)
               ((long)*_auStack_50 * 0x20 +
               subs.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node._M_size));
    for (uVar7 = 1;
        uVar7 < (ulong)((long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start - (long)_auStack_50 >> 2);
        uVar7 = uVar7 + 1) {
      iVar5 = get_intersection((string *)ppbVar1,
                               (string *)
                               ((long)_auStack_50[uVar7] * 0x20 +
                               subs.
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl._M_node._M_size));
      poVar4 = std::operator<<((ostream *)&std::cerr,"r is ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::substr((ulong)local_d8,(ulong)ppbVar1);
      std::__cxx11::string::operator=((string *)ppbVar1,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::append((string *)ppbVar1);
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,(string *)ppbVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
    _Var2 = sub._M_dataplus;
    std::__cxx11::string::~string((string *)ppbVar1);
    bVar3 = std::
            __next_permutation<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (_auStack_50,
                       perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
    if (_Var2._M_p <=
        perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)_Var2;
    }
  } while (bVar3);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)auStack_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&subs.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8);
  return 0;
}

Assistant:

int main()
{
	int n;
	std::cin >> n;
	std::cin.ignore();
	
	std::list<std::string> subs;
	for (int i = 0; i < n; i++)
	{
	    std::string sub;
		std::getline(std::cin, sub);
		std::cerr << sub << std::endl;
        subs.push_back(sub);
	}
	
	int j = 0;
	size_t result = 0;
	std::vector<std::string> pieces(subs.size());
	std::vector<int> perm(subs.size());
	for (std::list<std::string>::const_iterator i = subs.begin(); i != subs.end(); i++)
	{
	    perm[j] = j;
	    pieces[j] = *i;
	    result += i->length();
	    j++;
	}

	do
	{
	    copy(perm.begin(), perm.end(), std::ostream_iterator<int>(std::cerr, ", "));
	    std::cerr << std::endl;
	    
	    std::string s = pieces[perm[0]];
	    for (size_t i = 1; i < perm.size(); i++)
	    {
	        int r = get_intersection(s, pieces[perm[i]]);
	        std::cerr << "r is " << r << std::endl;
	        s = s.substr(0, s.length() - r);
	        s += pieces[perm[i]];
	    }
	    std::cerr << s << std::endl;
	    if (result > s.length())
	    {
	        result = s.length();
	    }
	} while (next_permutation(perm.begin(), perm.end()));

    std::cout << result << std::endl;

    return 0;
}